

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Value.cpp
# Opt level: O1

ostream * ccd::Json::operator<<(ostream *os,Value *val)

{
  variant_alternative_t<0UL,_variant<int,_double,_bool,_basic_string<char>,_map<basic_string<char>,_Value,_less<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_Value>_>_>,_vector<Value,_allocator<Value>_>_>_>
  *pvVar1;
  variant_alternative_t<4UL,_variant<int,_double,_bool,_basic_string<char>,_map<basic_string<char>,_Value,_less<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_Value>_>_>,_vector<Value,_allocator<Value>_>_>_>
  *obj;
  variant_alternative_t<2UL,_variant<int,_double,_bool,_basic_string<char>,_map<basic_string<char>,_Value,_less<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_Value>_>_>,_vector<Value,_allocator<Value>_>_>_>
  *pvVar2;
  variant_alternative_t<3UL,_variant<int,_double,_bool,_basic_string<char>,_map<basic_string<char>,_Value,_less<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_Value>_>_>,_vector<Value,_allocator<Value>_>_>_>
  *pvVar3;
  ostream *poVar4;
  variant_alternative_t<1UL,_variant<int,_double,_bool,_basic_string<char>,_map<basic_string<char>,_Value,_less<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_Value>_>_>,_vector<Value,_allocator<Value>_>_>_>
  *pvVar5;
  variant_alternative_t<5UL,_variant<int,_double,_bool,_basic_string<char>,_map<basic_string<char>,_Value,_less<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_Value>_>_>,_vector<Value,_allocator<Value>_>_>_>
  *array;
  ulong uVar6;
  char *pcVar7;
  
  poVar4 = os;
  switch(val->m_type) {
  case Int:
    pvVar1 = std::
             get<0ul,int,double,bool,std::__cxx11::string,std::map<std::__cxx11::string,ccd::Json::Value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ccd::Json::Value>>>,std::vector<ccd::Json::Value,std::allocator<ccd::Json::Value>>>
                       (&val->m_value);
    std::ostream::operator<<((ostream *)os,*pvVar1);
    break;
  case Double:
    pvVar5 = std::
             get<1ul,int,double,bool,std::__cxx11::string,std::map<std::__cxx11::string,ccd::Json::Value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ccd::Json::Value>>>,std::vector<ccd::Json::Value,std::allocator<ccd::Json::Value>>>
                       (&val->m_value);
    std::ostream::_M_insert<double>(*pvVar5);
    break;
  case Bool:
    pvVar2 = std::
             get<2ul,int,double,bool,std::__cxx11::string,std::map<std::__cxx11::string,ccd::Json::Value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ccd::Json::Value>>>,std::vector<ccd::Json::Value,std::allocator<ccd::Json::Value>>>
                       (&val->m_value);
    pcVar7 = "false";
    if ((ulong)*pvVar2 != 0) {
      pcVar7 = "true";
    }
    uVar6 = (ulong)*pvVar2 ^ 5;
    goto LAB_001127c9;
  case String:
    std::__ostream_insert<char,std::char_traits<char>>(os,"\"",1);
    pvVar3 = std::
             get<3ul,int,double,bool,std::__cxx11::string,std::map<std::__cxx11::string,ccd::Json::Value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ccd::Json::Value>>>,std::vector<ccd::Json::Value,std::allocator<ccd::Json::Value>>>
                       (&val->m_value);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (os,(pvVar3->_M_dataplus)._M_p,pvVar3->_M_string_length);
    uVar6 = 1;
    pcVar7 = "\"";
    goto LAB_001127c9;
  case Object:
    obj = std::
          get<4ul,int,double,bool,std::__cxx11::string,std::map<std::__cxx11::string,ccd::Json::Value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ccd::Json::Value>>>,std::vector<ccd::Json::Value,std::allocator<ccd::Json::Value>>>
                    (&val->m_value);
    operator<<(os,obj);
    break;
  case Array:
    array = std::
            get<5ul,int,double,bool,std::__cxx11::string,std::map<std::__cxx11::string,ccd::Json::Value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ccd::Json::Value>>>,std::vector<ccd::Json::Value,std::allocator<ccd::Json::Value>>>
                      (&val->m_value);
    operator<<(os,array);
    break;
  case Null:
    pcVar7 = "null";
    uVar6 = 4;
LAB_001127c9:
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar7,uVar6);
  }
  return os;
}

Assistant:

std::ostream & operator<< ( std::ostream & os, const Value& val )
{
	switch ( val.type() ) {
	case Value::Type::Int:
		os << static_cast<int>(val);
		break;
	case Value::Type::Double:
		os << static_cast<double>(val);
		break;
	case Value::Type::Bool:
		os << ( static_cast<bool>(val)?"true":"false" );
		break;
	case Value::Type::String:
		os << "\"" << static_cast<const std::string&>(val) << "\"";
		break;
	case Value::Type::Object:
		os << static_cast<const Object&>(val);
		break;
	case Value::Type::Array:
		os << static_cast<const Array&>(val);
		break;
	case Value::Type::Null:
		os << "null";
		break;
	default:
		break;
	}
	return os;
}